

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub5_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  __m128i res;
  __m128i pred;
  __m128i avg;
  __m128i src;
  __m128i TR;
  __m128i T;
  __m128i L;
  int i;
  longlong local_e8 [2];
  longlong local_d8 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  int local_7c;
  long local_78;
  int local_6c;
  long local_68;
  long local_60;
  undefined8 *local_58;
  longlong *local_50;
  longlong *local_48;
  longlong *local_40;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_78 = in_RCX;
  local_6c = in_EDX;
  local_68 = in_RSI;
  local_60 = in_RDI;
  for (local_7c = 0; local_7c + 4 <= local_6c; local_7c = local_7c + 4) {
    local_40 = (longlong *)(local_60 + (long)(local_7c + -1) * 4);
    local_98 = *local_40;
    lStack_90 = local_40[1];
    local_48 = (longlong *)(local_68 + (long)local_7c * 4);
    local_a8 = *local_48;
    lStack_a0 = local_48[1];
    local_50 = (longlong *)(local_68 + (long)(local_7c + 1) * 4);
    local_b8 = *local_50;
    lStack_b0 = local_50[1];
    local_58 = (undefined8 *)(local_60 + (long)local_7c * 4);
    local_c8 = *local_58;
    uStack_c0 = local_58[1];
    Average2_m128i((__m128i *)&local_98,(__m128i *)&local_b8,&local_d8);
    Average2_m128i(&local_d8,(__m128i *)&local_a8,&local_e8);
    local_28._0_1_ = (char)local_c8;
    local_28._1_1_ = (char)((ulong)local_c8 >> 8);
    local_28._2_1_ = (char)((ulong)local_c8 >> 0x10);
    local_28._3_1_ = (char)((ulong)local_c8 >> 0x18);
    local_28._4_1_ = (char)((ulong)local_c8 >> 0x20);
    local_28._5_1_ = (char)((ulong)local_c8 >> 0x28);
    local_28._6_1_ = (char)((ulong)local_c8 >> 0x30);
    local_28._7_1_ = (char)((ulong)local_c8 >> 0x38);
    uStack_20._0_1_ = (char)uStack_c0;
    uStack_20._1_1_ = (char)((ulong)uStack_c0 >> 8);
    uStack_20._2_1_ = (char)((ulong)uStack_c0 >> 0x10);
    uStack_20._3_1_ = (char)((ulong)uStack_c0 >> 0x18);
    uStack_20._4_1_ = (char)((ulong)uStack_c0 >> 0x20);
    uStack_20._5_1_ = (char)((ulong)uStack_c0 >> 0x28);
    uStack_20._6_1_ = (char)((ulong)uStack_c0 >> 0x30);
    uStack_20._7_1_ = (char)((ulong)uStack_c0 >> 0x38);
    local_38 = (char)local_e8[0];
    cStack_37 = (char)((ulong)local_e8[0] >> 8);
    cStack_36 = (char)((ulong)local_e8[0] >> 0x10);
    cStack_35 = (char)((ulong)local_e8[0] >> 0x18);
    cStack_34 = (char)((ulong)local_e8[0] >> 0x20);
    cStack_33 = (char)((ulong)local_e8[0] >> 0x28);
    cStack_32 = (char)((ulong)local_e8[0] >> 0x30);
    cStack_31 = (char)((ulong)local_e8[0] >> 0x38);
    cStack_30 = (char)local_e8[1];
    cStack_2f = (char)((ulong)local_e8[1] >> 8);
    cStack_2e = (char)((ulong)local_e8[1] >> 0x10);
    cStack_2d = (char)((ulong)local_e8[1] >> 0x18);
    cStack_2c = (char)((ulong)local_e8[1] >> 0x20);
    cStack_2b = (char)((ulong)local_e8[1] >> 0x28);
    cStack_2a = (char)((ulong)local_e8[1] >> 0x30);
    cStack_29 = (char)((ulong)local_e8[1] >> 0x38);
    local_8 = (undefined8 *)(local_78 + (long)local_7c * 4);
    local_18 = CONCAT17(local_28._7_1_ - cStack_31,
                        CONCAT16(local_28._6_1_ - cStack_32,
                                 CONCAT15(local_28._5_1_ - cStack_33,
                                          CONCAT14(local_28._4_1_ - cStack_34,
                                                   CONCAT13(local_28._3_1_ - cStack_35,
                                                            CONCAT12(local_28._2_1_ - cStack_36,
                                                                     CONCAT11(local_28._1_1_ -
                                                                              cStack_37,
                                                                              (char)local_28 -
                                                                              local_38)))))));
    uStack_10 = CONCAT17(uStack_20._7_1_ - cStack_29,
                         CONCAT16(uStack_20._6_1_ - cStack_2a,
                                  CONCAT15(uStack_20._5_1_ - cStack_2b,
                                           CONCAT14(uStack_20._4_1_ - cStack_2c,
                                                    CONCAT13(uStack_20._3_1_ - cStack_2d,
                                                             CONCAT12(uStack_20._2_1_ - cStack_2e,
                                                                      CONCAT11(uStack_20._1_1_ -
                                                                               cStack_2f,
                                                                               (char)uStack_20 -
                                                                               cStack_30)))))));
    *local_8 = local_18;
    local_8[1] = uStack_10;
    local_28 = local_c8;
    uStack_20 = uStack_c0;
  }
  if (local_7c != local_6c) {
    (*VP8LPredictorsSub_C[5])
              ((uint32_t *)(local_60 + (long)local_7c * 4),
               (uint32_t *)(local_68 + (long)local_7c * 4),local_6c - local_7c,
               (uint32_t *)(local_78 + (long)local_7c * 4));
  }
  return;
}

Assistant:

static void PredictorSub5_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i avg, pred, res;
    Average2_m128i(&L, &TR, &avg);
    Average2_m128i(&avg, &T, &pred);
    res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[5](in + i, upper + i, num_pixels - i, out + i);
  }
}